

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int av1_get_num_mod_workers_for_alloc
              (PrimaryMultiThreadInfo *p_mt_info,MULTI_THREADED_MODULES mod_name)

{
  int num_mod_workers;
  MULTI_THREADED_MODULES mod_name_local;
  PrimaryMultiThreadInfo *p_mt_info_local;
  
  num_mod_workers = p_mt_info->num_mod_workers[mod_name];
  if (1 < p_mt_info->num_mod_workers[10]) {
    num_mod_workers = p_mt_info->num_workers;
  }
  return num_mod_workers;
}

Assistant:

int av1_get_num_mod_workers_for_alloc(const PrimaryMultiThreadInfo *p_mt_info,
                                      MULTI_THREADED_MODULES mod_name) {
  int num_mod_workers = p_mt_info->num_mod_workers[mod_name];
  if (p_mt_info->num_mod_workers[MOD_FRAME_ENC] > 1) {
    // TODO(anyone): Change num_mod_workers to num_mod_workers[MOD_FRAME_ENC].
    // As frame parallel jobs will only perform multi-threading for the encode
    // stage, we can limit the allocations according to num_enc_workers per
    // frame parallel encode(a.k.a num_mod_workers[MOD_FRAME_ENC]).
    num_mod_workers = p_mt_info->num_workers;
  }
  return num_mod_workers;
}